

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O0

void mip_converter_test::feedInstance<mip_converter_test::MIPConverterTester>
               (MIPConverterTester *interface,MIPInstance *mip)

{
  bool bVar1;
  int iVar2;
  ExprBase e;
  pointer pOVar3;
  size_t sVar4;
  __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
  *in_RDI;
  const_iterator it_1;
  const_iterator it;
  vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
  *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff78;
  ExprBase in_stack_ffffffffffffff80;
  Sense in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
  local_30 [2];
  Objective *local_20;
  __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
  local_18 [2];
  __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
  *local_8;
  
  local_8 = in_RDI;
  iVar2 = mp::VarArrayDef::size((VarArrayDef *)0x134f65);
  e.impl_ = (Impl *)mp::VarArrayDef::plb((VarArrayDef *)0x134f7a);
  mp::VarArrayDef::pub((VarArrayDef *)0x134f90);
  mp::VarArrayDef::ptype((VarArrayDef *)0x134fa6);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::InputVariables(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   (double *)in_stack_ffffffffffffff50,(double *)in_stack_ffffffffffffff48,
                   (Type *)0x134fc1);
  local_18[0]._M_current =
       (Objective *)
       std::
       vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
       ::begin((vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
                *)in_stack_ffffffffffffff48);
  while( true ) {
    local_20 = (Objective *)
               std::
               vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
               ::end((vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
                      *)in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff80.impl_ = (Impl *)local_8;
    pOVar3 = __gnu_cxx::
             __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
             ::operator->(local_18);
    in_stack_ffffffffffffff88 = pOVar3->sense_;
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
    ::operator->(local_18);
    sVar4 = MIPInstance::SparseVec::size((SparseVec *)0x135042);
    in_stack_ffffffffffffff8c = (undefined4)sVar4;
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
    ::operator->(local_18);
    in_stack_ffffffffffffff90 =
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x13505f);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
    ::operator->(local_18);
    in_stack_ffffffffffffff98 =
         (double *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x135081)
    ;
    mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x135093);
    mp::
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::InputObjective(in_stack_ffffffffffffff78,(Type)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (int *)in_stack_ffffffffffffff60,(NumericExpr)in_stack_ffffffffffffff80.impl_);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Objective_*,_std::vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>_>
    ::operator++(local_18);
  }
  local_30[0]._M_current =
       (Constraint *)
       std::
       vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
       ::begin(in_stack_ffffffffffffff48);
  while( true ) {
    std::
    vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
    ::end(in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 = local_8;
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator->(local_30);
    MIPInstance::SparseVec::size((SparseVec *)0x135141);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator->(local_30);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x13515a);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator->(local_30);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x135178);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator->(local_30);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator->(local_30);
    mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x1351b7);
    mp::
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::InputAlgebraicCon((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),(int)((ulong)in_RDI >> 0x20),
                        in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90,
                        (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (double)in_stack_ffffffffffffff80.impl_,(NumericExpr)e.impl_);
    __gnu_cxx::
    __normal_iterator<const_mip_converter_test::MIPInstance::Constraint_*,_std::vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>_>
    ::operator++(local_30);
  }
  return;
}

Assistant:

void feedInstance( Interface& interface, const MIPInstance& mip ) {
  interface.InputVariables(mip.vars_.size(),
                           mip.vars_.plb(), mip.vars_.pub(),
                           mip.vars_.ptype());
  for (MIPInstance::ObjectivesContainer::const_iterator it = mip.objs_.begin();
       it!=mip.objs_.end(); ++it) {
    interface.InputObjective((mp::obj::Type)it->sense_,
                             it->le_.size(), it->le_.c_.data(), it->le_.v_.data());
  }
  for (MIPInstance::ConstraintsContainer::const_iterator it = mip.cons_.begin();
       it!=mip.cons_.end(); ++it) {
    interface.InputAlgebraicCon(it->le_.size(), it->le_.c_.data(), it->le_.v_.data(),
                             it->lb_, it->ub_);
  }
}